

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

void wmap(settings_w *sesskey,char *outkey,Conf *conf,int primary,_Bool include_values)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  byte *value;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  size_t factor1;
  undefined3 in_register_00000081;
  int iVar8;
  byte *pbVar9;
  char *key;
  byte *local_58;
  undefined4 local_4c;
  Conf *local_48;
  char *local_40;
  settings_w *local_38;
  
  local_4c = CONCAT31(in_register_00000081,include_values);
  local_38 = sesskey;
  pcVar1 = conf_get_str_strs(conf,primary,(char *)0x0,(char **)&local_58);
  local_48 = conf;
  if (pcVar1 == (char *)0x0) {
    factor1 = 1;
  }
  else {
    iVar8 = 1;
    local_40 = outkey;
    do {
      pbVar7 = local_58;
      sVar2 = strlen((char *)local_58);
      sVar3 = strlen(pcVar1);
      conf = local_48;
      iVar8 = iVar8 + ((int)sVar3 + (int)sVar2) * 2 + 2;
      pcVar1 = conf_get_str_strs(local_48,primary,(char *)pbVar7,(char **)&local_58);
    } while (pcVar1 != (char *)0x0);
    factor1 = (size_t)iVar8;
    outkey = local_40;
  }
  value = (byte *)safemalloc(factor1,1,0);
  pbVar4 = (byte *)conf_get_str_strs(conf,primary,(char *)0x0,(char **)&local_58);
  pbVar7 = value;
  pbVar9 = local_58;
joined_r0x00117a79:
  local_58 = pbVar9;
  if (pbVar4 == (byte *)0x0) {
    *pbVar7 = 0;
    write_setting_s(local_38,outkey,(char *)value);
    safefree(value);
    return;
  }
  if (((primary == 0xb0) && (*pbVar4 == 0x44)) && (pbVar4[1] == 0)) {
    local_58 = (byte *)dupstr((char *)pbVar9);
    pcVar1 = strchr((char *)local_58,0x4c);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = 'D';
    }
    pbVar4 = (byte *)0x123a49;
  }
  else {
    pbVar9 = (byte *)0x0;
  }
  pbVar5 = local_58;
  if (pbVar7 != value) {
    *pbVar7 = 0x2c;
    pbVar7 = pbVar7 + 1;
  }
  do {
    bVar6 = *pbVar5;
    if ((bVar6 - 0x2c < 0x31) && ((0x1000000020001U >> ((ulong)(bVar6 - 0x2c) & 0x3f) & 1) != 0)) {
      *pbVar7 = 0x5c;
      pbVar7 = pbVar7 + 1;
      bVar6 = *pbVar5;
    }
    else if (bVar6 == 0) break;
    *pbVar7 = bVar6;
    pbVar7 = pbVar7 + 1;
    pbVar5 = pbVar5 + 1;
  } while( true );
  if ((char)local_4c != '\0') {
    *pbVar7 = 0x3d;
    do {
      bVar6 = *pbVar4;
      if ((bVar6 - 0x2c < 0x31) && ((0x1000000020001U >> ((ulong)(bVar6 - 0x2c) & 0x3f) & 1) != 0))
      {
        pbVar7[1] = 0x5c;
        pbVar7 = pbVar7 + 2;
        bVar6 = *pbVar4;
      }
      else {
        pbVar7 = pbVar7 + 1;
        if (bVar6 == 0) break;
      }
      *pbVar7 = bVar6;
      pbVar4 = pbVar4 + 1;
    } while( true );
  }
  if (pbVar9 != (byte *)0x0) {
    free(local_58);
    local_58 = pbVar9;
  }
  pbVar4 = (byte *)conf_get_str_strs(local_48,primary,(char *)local_58,(char **)&local_58);
  pbVar9 = local_58;
  goto joined_r0x00117a79;
}

Assistant:

static void wmap(settings_w *sesskey, char const *outkey, Conf *conf,
                 int primary, bool include_values)
{
    char *buf, *p, *key, *realkey;
    const char *val, *q;
    int len;

    len = 1;                           /* allow for NUL */

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key))
        len += 2 + 2 * (strlen(key) + strlen(val));   /* allow for escaping */

    buf = snewn(len, char);
    p = buf;

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key)) {

        if (primary == CONF_portfwd && !strcmp(val, "D")) {
            /*
             * Backwards-compatibility hack, as above: translate from
             * the sensible internal representation of dynamic
             * forwardings (key "L<port>", value "D") to the
             * conceptually incoherent legacy storage format (key
             * "D<port>", value empty).
             */
            char *L;

            realkey = key;             /* restore it at end of loop */
            val = "";
            key = dupstr(key);
            L = strchr(key, 'L');
            if (L) *L = 'D';
        } else {
            realkey = NULL;
        }

        if (p != buf)
            *p++ = ',';
        for (q = key; *q; q++) {
            if (*q == '=' || *q == ',' || *q == '\\')
                *p++ = '\\';
            *p++ = *q;
        }
        if (include_values) {
            *p++ = '=';
            for (q = val; *q; q++) {
                if (*q == '=' || *q == ',' || *q == '\\')
                    *p++ = '\\';
                *p++ = *q;
            }
        }

        if (realkey) {
            free(key);
            key = realkey;
        }
    }
    *p = '\0';
    write_setting_s(sesskey, outkey, buf);
    sfree(buf);
}